

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkInitialSetup(ARKodeMem ark_mem,realtype tout)

{
  int iVar1;
  ARKodeMem in_RDI;
  void *in_XMM0_Qa;
  double dVar2;
  int conOK;
  realtype htmp;
  realtype rh;
  realtype tout_hin;
  int istate;
  int hflag;
  int retval;
  realtype in_stack_00000050;
  ARKodeMem in_stack_00000058;
  realtype in_stack_ffffffffffffffa8;
  N_Vector in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  N_Vector in_stack_ffffffffffffffc0;
  int flag;
  ARKodeMem in_stack_ffffffffffffffc8;
  uint local_4;
  
  if (in_RDI->step_init == (ARKTimestepInitFn)0x0) {
    arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup","Time stepper module is missing");
    local_4 = 0xffffffea;
  }
  else {
    local_4 = (*in_RDI->step_init)(in_RDI,in_RDI->init_type);
    if (local_4 == 0) {
      if (((in_RDI->fixedstep == 0) || (in_RDI->hin != 0.0)) || (NAN(in_RDI->hin))) {
        if (((in_RDI->user_efun == 0) && (in_RDI->atolmin0 != 0)) &&
           (in_RDI->yn->ops->nvmin == (_func_realtype_N_Vector *)0x0)) {
          arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                          "N_VMin unimplemented (required by error-weight function)");
          local_4 = 0xffffffea;
        }
        else if (((in_RDI->user_rfun == 0) && (in_RDI->rwt_is_ewt == 0)) &&
                ((in_RDI->Ratolmin0 != 0 &&
                 (in_RDI->yn->ops->nvmin == (_func_realtype_N_Vector *)0x0)))) {
          arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                          "N_VMin unimplemented (required by residual-weight function)");
          local_4 = 0xffffffea;
        }
        else {
          if (in_RDI->tstopset != 0) {
            if ((in_RDI->h != 0.0) || (NAN(in_RDI->h))) {
              in_stack_ffffffffffffffb0 = (N_Vector)in_RDI->h;
            }
            else {
              in_stack_ffffffffffffffb0 = (N_Vector)((double)in_XMM0_Qa - in_RDI->tcur);
            }
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb0;
            if ((in_RDI->tstop - in_RDI->tcur) * (double)in_stack_ffffffffffffffb0 <= 0.0) {
              arkProcessError((ARKodeMem)in_RDI->tstop,(int)in_RDI->tcur,(char *)in_RDI,
                              (char *)0xffffffea,"ARKode","arkInitialSetup",
                              "The value tstop = %lg is behind current t = %lg in the direction of integration."
                             );
              return -0x16;
            }
          }
          if ((in_RDI->constraintsSet == 0) ||
             (in_stack_ffffffffffffffbc =
                   N_VConstrMask(in_stack_ffffffffffffffc0,
                                 (N_Vector)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb0), in_stack_ffffffffffffffbc != 0)) {
            flag = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
            iVar1 = (*in_RDI->efun)(in_RDI->yn,in_RDI->ewt,in_RDI->e_data);
            if (iVar1 == 0) {
              if (in_RDI->rwt_is_ewt == 0) {
                iVar1 = (*in_RDI->rfun)(in_RDI->yn,in_RDI->rwt,in_RDI->r_data);
                if (iVar1 != 0) {
                  if (in_RDI->itol == 2) {
                    arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                                    "The user-provide RwtSet function failed.");
                  }
                  else {
                    arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                                    "Initial rwt has component(s) equal to zero (illegal).");
                  }
                  return -0x16;
                }
              }
              else {
                in_RDI->rwt = in_RDI->ewt;
              }
              if ((in_RDI->h == 0.0) && (!NAN(in_RDI->h))) {
                in_RDI->h = 1.0;
              }
              iVar1 = (*in_RDI->step_fullrhs)(in_RDI,in_RDI->tcur,in_RDI->yn,in_RDI->fn,0);
              if (iVar1 == 0) {
                if ((in_RDI->interp == (ARKInterp)0x0) ||
                   (local_4 = arkInterpInit((void *)CONCAT44(in_stack_ffffffffffffffbc,
                                                             in_stack_ffffffffffffffb8),
                                            (ARKInterp)in_stack_ffffffffffffffb0,
                                            in_stack_ffffffffffffffa8), local_4 == 0)) {
                  in_RDI->initialized = 1;
                  if ((in_RDI->h0u != 0.0) || (NAN(in_RDI->h0u))) {
                    if (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h) {
                      in_RDI->hprime =
                           (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
                      in_RDI->eta = in_RDI->hprime / in_RDI->h;
                    }
                  }
                  else {
                    in_RDI->h = in_RDI->hin;
                    if (((in_RDI->h != 0.0) || (NAN(in_RDI->h))) &&
                       (((double)in_XMM0_Qa - in_RDI->tcur) * in_RDI->h < 0.0)) {
                      arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                                      "h0 and tout - t0 inconsistent.");
                      return -0x16;
                    }
                    if ((in_RDI->h != 0.0) || (NAN(in_RDI->h))) {
                      if (in_RDI->nst == 0) {
                        in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->etamx1;
                      }
                      else {
                        in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->growth;
                      }
                    }
                    else {
                      in_RDI->h = ABS((double)in_XMM0_Qa - in_RDI->tcur);
                      if ((in_RDI->h == 0.0) && (!NAN(in_RDI->h))) {
                        in_RDI->h = 1.0;
                      }
                      iVar1 = arkHin(in_stack_00000058,in_stack_00000050);
                      if (iVar1 != 0) {
                        iVar1 = arkHandleFailure(in_stack_ffffffffffffffc8,flag);
                        return iVar1;
                      }
                      in_RDI->hadapt_mem->etamax = in_RDI->hadapt_mem->etamx1;
                    }
                    dVar2 = ABS(in_RDI->h) * in_RDI->hmax_inv;
                    if (1.0 < dVar2) {
                      in_RDI->h = in_RDI->h / dVar2;
                    }
                    if (ABS(in_RDI->h) < in_RDI->hmin) {
                      in_RDI->h = (in_RDI->hmin / ABS(in_RDI->h)) * in_RDI->h;
                    }
                    if ((in_RDI->tstopset != 0) &&
                       (0.0 < ((in_RDI->tcur + in_RDI->h) - in_RDI->tstop) * in_RDI->h)) {
                      in_RDI->h = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
                    }
                    in_RDI->h0u = in_RDI->h;
                    in_RDI->eta = 1.0;
                    in_RDI->hprime = in_RDI->h;
                  }
                  if (((in_RDI->root_mem == (ARKodeRootMem)0x0) || (in_RDI->root_mem->nrtfn < 1)) ||
                     (iVar1 = arkRootCheck1(in_XMM0_Qa), iVar1 != -0xc)) {
                    local_4 = 0;
                  }
                  else {
                    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xfffffff4,"ARKode",
                                    "arkRootCheck1",
                                    "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                                   );
                    local_4 = 0xfffffff4;
                  }
                }
              }
              else {
                local_4 = 0xfffffff8;
              }
            }
            else {
              if (in_RDI->itol == 2) {
                arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                                "The user-provide EwtSet function failed.");
              }
              else {
                arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                                "Initial ewt has component(s) equal to zero (illegal).");
              }
              local_4 = 0xffffffea;
            }
          }
          else {
            arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                            "y0 fails to satisfy constraints.");
            local_4 = 0xffffffea;
          }
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,"ARKode","arkInitialSetup",
                        "Fixed step mode enabled, but no step size set");
        local_4 = 0xffffffea;
      }
    }
    else {
      arkProcessError(in_RDI,(int)(ulong)local_4,"ARKode","arkInitialSetup",
                      "Error in initialization of time stepper module");
    }
  }
  return local_4;
}

Assistant:

int arkInitialSetup(ARKodeMem ark_mem, realtype tout)
{
  int retval, hflag, istate;
  realtype tout_hin, rh, htmp;
  booleantype conOK;

  /* Set up the time stepper module */
  if (ark_mem->step_init == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkInitialSetup", "Time stepper module is missing");
    return(ARK_ILL_INPUT);
  }
  retval = ark_mem->step_init(ark_mem, ark_mem->init_type);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode", "arkInitialSetup",
                    "Error in initialization of time stepper module");
    return(retval);
  }

  /* Check that user has supplied an initial step size if fixedstep mode is on */
  if ( (ark_mem->fixedstep) && (ark_mem->hin == ZERO) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "Fixed step mode enabled, but no step size set");
    return(ARK_ILL_INPUT);
  }

  /* If using a built-in routine for error/residual weights with abstol==0,
     ensure that N_VMin is available */
  if ((!ark_mem->user_efun) && (ark_mem->atolmin0) && (!ark_mem->yn->ops->nvmin)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "N_VMin unimplemented (required by error-weight function)");
    return(ARK_ILL_INPUT);
  }
  if ( (!ark_mem->user_rfun) && (!ark_mem->rwt_is_ewt) &&
       (ark_mem->Ratolmin0) && (!ark_mem->yn->ops->nvmin) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                    "N_VMin unimplemented (required by residual-weight function)");
    return(ARK_ILL_INPUT);
  }

  /* Test input tstop for legality (correct direction of integration) */
  if ( ark_mem->tstopset ) {
    htmp = (ark_mem->h == ZERO) ? tout - ark_mem->tcur : ark_mem->h;
    if ( (ark_mem->tstop - ark_mem->tcur) * htmp <= ZERO ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                      MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
      return(ARK_ILL_INPUT);
    }
  }

  /* Check to see if y0 satisfies constraints */
  if (ark_mem->constraintsSet) {
    conOK = N_VConstrMask(ark_mem->constraints, ark_mem->yn, ark_mem->tempv1);
    if (!conOK) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup", MSG_ARK_Y0_FAIL_CONSTR);
      return(ARK_ILL_INPUT);
    }
  }

  /* Load initial error weights */
  retval = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
  if (retval != 0) {
    if (ark_mem->itol == ARK_WF)
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkInitialSetup", MSG_ARK_EWT_FAIL);
    else
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkInitialSetup", MSG_ARK_BAD_EWT);
    return(ARK_ILL_INPUT);
  }

  /* Load initial residual weights */
  if (ark_mem->rwt_is_ewt) {      /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  } else {
    retval = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
    if (retval != 0) {
      if (ark_mem->itol == ARK_WF)
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkInitialSetup", MSG_ARK_RWT_FAIL);
      else
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkInitialSetup", MSG_ARK_BAD_RWT);
      return(ARK_ILL_INPUT);
    }
  }

  /* If necessary, temporarily set h as it is used to compute the tolerance in a
     potential mass matrix solve when computing the full rhs */
  if (ark_mem->h == ZERO) ark_mem->h = ONE;

  /* Call fullrhs (used in estimating initial step, explicit steppers, Hermite
     interpolation module, and possibly (but not always) arkRootCheck1) */
  retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->yn,
                                 ark_mem->fn, ARK_FULLRHS_START);
  if (retval != 0) return(ARK_RHSFUNC_FAIL);

  /* Fill initial interpolation data (if needed) */
  if (ark_mem->interp != NULL) {
    retval = arkInterpInit(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != 0)  return(retval);
  }

  /* initialization complete */
  ark_mem->initialized = SUNTRUE;

  /* Set initial step size */
  if (ark_mem->h0u == ZERO) {

    /* Check input h for validity */
    ark_mem->h = ark_mem->hin;
    if ( (ark_mem->h != ZERO) &&
         ((tout-ark_mem->tcur)*ark_mem->h < ZERO) ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkInitialSetup",
                      MSG_ARK_BAD_H0);
      return(ARK_ILL_INPUT);
    }

    /* Estimate initial h if not set */
    if (ark_mem->h == ZERO) {
      /* Again, temporarily set h for estimating an optimal value */
      ark_mem->h = SUNRabs(tout - ark_mem->tcur);
      if (ark_mem->h == ZERO)  ark_mem->h = ONE;
      /* Estimate the first step size */
      tout_hin = tout;
      if ( ark_mem->tstopset &&
           (tout-ark_mem->tcur)*(tout-ark_mem->tstop) > ZERO )
        tout_hin = ark_mem->tstop;
      hflag = arkHin(ark_mem, tout_hin);
      if (hflag != ARK_SUCCESS) {
        istate = arkHandleFailure(ark_mem, hflag);
        return(istate);
      }
      /* Use first step growth factor for estimated h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    } else if (ark_mem->nst == 0) {
      /* Use first step growth factor for user defined h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    } else {
      /* Use standard growth factor (e.g., for reset) */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;
    }

    /* Enforce step size bounds */
    rh = SUNRabs(ark_mem->h)*ark_mem->hmax_inv;
    if (rh > ONE) ark_mem->h /= rh;
    if (SUNRabs(ark_mem->h) < ark_mem->hmin)
      ark_mem->h *= ark_mem->hmin/SUNRabs(ark_mem->h);

    /* Check for approach to tstop */
    if (ark_mem->tstopset) {
      if ( (ark_mem->tcur + ark_mem->h - ark_mem->tstop)*ark_mem->h > ZERO ) {
        ark_mem->h = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      }
    }

    /* Set initial time step factors */
    ark_mem->h0u    = ark_mem->h;
    ark_mem->eta    = ONE;
    ark_mem->hprime = ark_mem->h;
  } else {
    /* If next step would overtake tstop, adjust stepsize */
    if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur)*(ONE-FOUR*ark_mem->uround);
      ark_mem->eta = ark_mem->hprime/ark_mem->h;
    }
  }

  /* Check for zeros of root function g at and near t0. */
  if (ark_mem->root_mem != NULL) {
    if (ark_mem->root_mem->nrtfn > 0) {
      retval = arkRootCheck1((void*) ark_mem);

      if (retval == ARK_RTFUNC_FAIL) {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkRootCheck1",
                        MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
        return(ARK_RTFUNC_FAIL);
      }
    }
  }

  return(ARK_SUCCESS);
}